

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::GetElementIHelper
              (Var instance,Var index,Var receiver,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  IndexType IVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JavascriptString *propertyString;
  RecyclableObject *pRVar7;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  JavascriptString *propertyNameString;
  Var index_local;
  PropertyRecord *propertyRecord;
  RecyclableObject *pRStack_30;
  uint32 indexVal;
  RecyclableObject *object;
  Var value;
  
  pRStack_30 = (RecyclableObject *)0x0;
  propertyNameString = (JavascriptString *)index;
  bVar2 = GetPropertyObjectForGetElementI(instance,index,scriptContext,&stack0xffffffffffffffd0);
  if (!bVar2) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  index_local = (Var)0x0;
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  object = (RecyclableObject *)0x0;
  IVar3 = GetIndexType(&propertyNameString,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                       (PropertyRecord **)&index_local,(JavascriptString **)&info.inlineCacheIndex,
                       false,true);
  if (IVar3 == IndexType_JavascriptString) {
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    iVar4 = GetPropertyWPCache<false,Js::JavascriptString*>
                      (receiver,pRStack_30,(JavascriptString *)info._56_8_,&object,scriptContext,
                       (PropertyValueInfo *)local_90);
  }
  else if (IVar3 == IndexType_Number) {
    iVar4 = GetItem(receiver,pRStack_30,propertyRecord._4_4_,&object,scriptContext);
  }
  else {
    if (index_local == (Var)0x0) {
      bVar2 = CanShortcutOnUnknownPropertyName(pRStack_30);
      if (!bVar2) {
        IVar3 = GetIndexTypeFromPrimitive
                          (propertyNameString,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                           (PropertyRecord **)&index_local,
                           (JavascriptString **)&info.inlineCacheIndex,true,true);
        if (IVar3 != IndexType_PropertyId) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x107b,"(indexType == IndexType_PropertyId)",
                                      "indexType == IndexType_PropertyId");
          if (!bVar2) goto LAB_0099d5b7;
          *puVar6 = 0;
        }
        if (index_local != (Var)0x0) goto LAB_0099d4b9;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x107c,"(propertyRecord != nullptr)",
                                    "propertyRecord != nullptr");
        if (!bVar2) goto LAB_0099d5b7;
        *puVar6 = 0;
      }
      if (index_local == (Var)0x0) {
        propertyString = JavascriptConversion::ToString(propertyNameString,scriptContext);
        ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,propertyString,(PropertyRecord **)local_90);
        BVar5 = GetProperty(receiver,pRStack_30,*(PropertyId *)&((Type *)((long)local_90 + 8))->ptr,
                            &object,scriptContext,(PropertyValueInfo *)0x0);
        if (BVar5 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x108d,
                                      "(!JavascriptOperators::GetProperty(receiver, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext))"
                                      ,
                                      "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                     );
          if (!bVar2) {
LAB_0099d5b7:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        goto LAB_0099d5a4;
      }
    }
LAB_0099d4b9:
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    iVar4 = GetPropertyWPCache<false,int>
                      (receiver,pRStack_30,*(int *)((long)index_local + 8),&object,scriptContext,
                       (PropertyValueInfo *)local_90);
  }
  if (iVar4 != 0) {
    return object;
  }
LAB_0099d5a4:
  pRVar7 = ScriptContext::GetMissingItemResult(scriptContext);
  return pRVar7;
}

Assistant:

Var JavascriptOperators::GetElementIHelper(Var instance, Var index, Var receiver, ScriptContext* scriptContext)
    {
        RecyclableObject* object = nullptr;
        if (!JavascriptOperators::GetPropertyObjectForGetElementI(instance, index, scriptContext, &object))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        Var value = nullptr;

        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);

        if (indexType == IndexType_Number)
        {
            if (JavascriptOperators::GetItem(receiver, object, indexVal, &value, scriptContext))
            {
                return value;
            }
        }
        else if (indexType == IndexType_JavascriptString)
        {
            PropertyValueInfo info;
            if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(receiver, object, propertyNameString, &value, scriptContext, &info))
            {
                return value;
            }
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);
            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, true, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                PropertyValueInfo info;
                if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(receiver, object, propertyRecord->GetPropertyId(), &value, scriptContext, &info))
                {
                    return value;
                }
            }
#if DBG
            else
            {
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::GetProperty(receiver, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext), "how did this property come? See OS Bug 2727708 if you see this come from the web");
            }
#endif
        }

        return scriptContext->GetMissingItemResult();
    }